

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Framebuffer.cpp
# Opt level: O0

Ptr<Framebuffer>
myvk::Framebuffer::Create
          (Ptr<RenderPass> *render_pass,
          vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
          *image_views,VkExtent2D *extent,uint32_t layers)

{
  VkResult VVar1;
  element_type *peVar2;
  size_type sVar3;
  element_type *this;
  VkImageView pVVar4;
  reference ppVVar5;
  element_type *peVar6;
  element_type *this_00;
  VkDevice pVVar7;
  VkExtent2D *in_RCX;
  vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  uint32_t in_R8D;
  Ptr<Framebuffer> PVar8;
  VkFramebufferCreateInfo create_info;
  uint32_t i;
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> attachments;
  shared_ptr<myvk::Framebuffer> ret;
  shared_ptr<myvk::Framebuffer> *in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  allocator_type *in_stack_fffffffffffffed0;
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *this_01;
  size_type in_stack_fffffffffffffed8;
  PFN_vkCreateFramebuffer p_Var9;
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *in_stack_fffffffffffffee0;
  vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  *in_stack_ffffffffffffff58;
  vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  *in_stack_ffffffffffffff60;
  uint local_68;
  allocator<VkImageView_T_*> local_61;
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> local_60 [2];
  uint32_t local_24;
  VkExtent2D *local_20;
  vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  *local_18;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::make_shared<myvk::Framebuffer>();
  std::__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2e21de);
  std::shared_ptr<myvk::RenderPass>::operator=
            ((shared_ptr<myvk::RenderPass> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (shared_ptr<myvk::RenderPass> *)in_stack_fffffffffffffeb8);
  std::__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2e220f);
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  peVar2 = std::__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2e2244);
  (peVar2->super_FramebufferBase).m_extent = *local_20;
  peVar2 = std::__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2e2265);
  (peVar2->super_FramebufferBase).m_layers = local_24;
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::size(local_18);
  std::allocator<VkImageView_T_*>::allocator((allocator<VkImageView_T_*> *)0x2e2290);
  std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::vector
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::allocator<VkImageView_T_*>::~allocator(&local_61);
  local_68 = 0;
  while( true ) {
    sVar3 = std::
            vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
            ::size(local_18);
    if (sVar3 <= local_68) break;
    std::
    vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>::
    operator[](local_18,(ulong)local_68);
    this = std::__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2e2309);
    pVVar4 = ImageView::GetHandle(this);
    ppVVar5 = std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::operator[]
                        (local_60,(ulong)local_68);
    *ppVVar5 = pVVar4;
    local_68 = local_68 + 1;
  }
  peVar6 = std::__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2e23ec);
  RenderPass::GetHandle(peVar6);
  this_01 = local_60;
  std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::size(this_01);
  std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::data
            ((vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *)0x2e242b);
  p_Var9 = vkCreateFramebuffer;
  peVar6 = std::__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2e2480);
  (*(peVar6->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  this_00 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2e249d);
  pVVar7 = Device::GetHandle(this_00);
  peVar2 = std::__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2e24b9);
  VVar1 = (*p_Var9)(pVVar7,(VkFramebufferCreateInfo *)&stack0xffffffffffffff58,
                    (VkAllocationCallbacks *)0x0,&(peVar2->super_FramebufferBase).m_framebuffer);
  if (VVar1 == VK_SUCCESS) {
    std::shared_ptr<myvk::Framebuffer>::shared_ptr
              ((shared_ptr<myvk::Framebuffer> *)(ulong)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8);
  }
  else {
    std::shared_ptr<myvk::Framebuffer>::shared_ptr
              ((shared_ptr<myvk::Framebuffer> *)CONCAT44(VVar1,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8);
  }
  std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::~vector(this_01);
  std::shared_ptr<myvk::Framebuffer>::~shared_ptr((shared_ptr<myvk::Framebuffer> *)0x2e2537);
  PVar8.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar8.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<Framebuffer>)PVar8.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Framebuffer> Framebuffer::Create(const Ptr<RenderPass> &render_pass, const std::vector<Ptr<ImageView>> &image_views,
                                     const VkExtent2D &extent, uint32_t layers) {
	auto ret = std::make_shared<Framebuffer>();
	ret->m_render_pass_ptr = render_pass;
	ret->m_image_view_ptrs = image_views;
	ret->m_extent = extent;
	ret->m_layers = layers;

	std::vector<VkImageView> attachments(image_views.size());
	for (uint32_t i = 0; i < image_views.size(); ++i)
		attachments[i] = image_views[i]->GetHandle();

	VkFramebufferCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
	create_info.renderPass = render_pass->GetHandle();
	create_info.attachmentCount = attachments.size();
	create_info.pAttachments = attachments.data();
	create_info.width = extent.width;
	create_info.height = extent.height;
	create_info.layers = layers;

	if (vkCreateFramebuffer(render_pass->GetDevicePtr()->GetHandle(), &create_info, nullptr, &ret->m_framebuffer) !=
	    VK_SUCCESS)
		return nullptr;

	return ret;
}